

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_insert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQObject *val;
  SQRESULT SVar4;
  SQInteger idx;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  pSVar3 = SQVM::GetAt(v,v->_stackbase + 1);
  val = &SQVM::GetAt(v,v->_stackbase + 2)->super_SQObject;
  if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
    idx = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
  }
  else {
    idx = (pSVar3->super_SQObject)._unVal.nInteger;
  }
  bVar1 = SQArray::Insert((pSVar2->super_SQObject)._unVal.pArray,idx,val);
  if (bVar1) {
    sq_pop(v,2);
    return 1;
  }
  SVar4 = sq_throwerror(v,"index out of range");
  return SVar4;
}

Assistant:

static SQInteger array_insert(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQObject &idx=stack_get(v,2);
    SQObject &val=stack_get(v,3);
    if(!_array(o)->Insert(tointeger(idx),val))
        return sq_throwerror(v,_SC("index out of range"));
    sq_pop(v,2);
    return 1;
}